

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_sha256_eq(secp256k1_sha256 *sha1,secp256k1_sha256 *sha2)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if ((sha1->bytes & 0x3f) == 0) {
    if (sha1->bytes == sha2->bytes) {
      iVar1 = secp256k1_memcmp_var(sha1,sha2,0x20);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = "test condition failed: secp256k1_memcmp_var(sha1->s, sha2->s, sizeof(sha1->s)) == 0"
      ;
      uVar2 = 0x26b;
    }
    else {
      pcVar3 = "test condition failed: sha1->bytes == sha2->bytes";
      uVar2 = 0x26a;
    }
  }
  else {
    pcVar3 = "test condition failed: (sha1->bytes & 0x3F) == 0";
    uVar2 = 0x268;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void test_sha256_eq(const secp256k1_sha256 *sha1, const secp256k1_sha256 *sha2) {
    /* Is buffer fully consumed? */
    CHECK((sha1->bytes & 0x3F) == 0);

    CHECK(sha1->bytes == sha2->bytes);
    CHECK(secp256k1_memcmp_var(sha1->s, sha2->s, sizeof(sha1->s)) == 0);
}